

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlRegexpPtr xmlAutomataCompile(xmlAutomataPtr am)

{
  xmlRegexpPtr ret;
  xmlAutomataPtr am_local;
  
  if ((am == (xmlAutomataPtr)0x0) || (am->error != 0)) {
    am_local = (xmlAutomataPtr)0x0;
  }
  else {
    xmlFAEliminateEpsilonTransitions(am);
    am_local = (xmlAutomataPtr)xmlRegEpxFromParse(am);
  }
  return (xmlRegexpPtr)am_local;
}

Assistant:

xmlRegexpPtr
xmlAutomataCompile(xmlAutomataPtr am) {
    xmlRegexpPtr ret;

    if ((am == NULL) || (am->error != 0)) return(NULL);
    xmlFAEliminateEpsilonTransitions(am);
    /* xmlFAComputesDeterminism(am); */
    ret = xmlRegEpxFromParse(am);

    return(ret);
}